

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lex_longstring(LexState *ls,TValue *tv,int sep)

{
  LexChar LVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  GCstr *pGVar5;
  SBuf *pSVar6;
  int in_EDX;
  ErrMsg EVar8;
  LexState *in_RSI;
  LexState *in_RDI;
  GCstr *str;
  char *p;
  char *p_1;
  char *p_3;
  char *p_2;
  MSize in_stack_fffffffffffffe2c;
  uint in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  int iVar7;
  undefined4 in_stack_fffffffffffffe3c;
  LexState *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  char *local_50;
  char *local_38;
  char *local_20;
  char *local_8;
  
  LVar1 = in_RDI->c;
  pSVar6 = &in_RDI->sb;
  if ((in_RDI->sb).e.ptr32 == (pSVar6->p).ptr32) {
    local_8 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           in_stack_fffffffffffffe2c);
  }
  else {
    local_8 = (char *)(ulong)(pSVar6->p).ptr32;
  }
  *local_8 = (char)LVar1;
  (pSVar6->p).ptr32 = (int)local_8 + 1;
  if (in_RDI->p < in_RDI->pe) {
    pbVar2 = (byte *)in_RDI->p;
    in_RDI->p = (char *)(pbVar2 + 1);
    uVar4 = (uint)*pbVar2;
  }
  else {
    uVar4 = lex_more((LexState *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  in_RDI->c = uVar4;
  if ((in_RDI->c == 10) || (in_RDI->c == 0xd)) {
    lex_newline((LexState *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  }
  do {
    while( true ) {
      while( true ) {
        iVar7 = in_RDI->c;
        if (iVar7 == -1) {
          _EVar8 = LJ_ERR_XLCOM;
          if (in_RSI != (LexState *)0x0) {
            _EVar8 = LJ_ERR_XLSTR;
          }
          lj_lex_error(in_RDI,0x121,_EVar8);
        }
        if ((iVar7 != 10) && (iVar7 != 0xd)) break;
        pSVar6 = &in_RDI->sb;
        if ((in_RDI->sb).e.ptr32 == (pSVar6->p).ptr32) {
          local_50 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffe34,
                                                   in_stack_fffffffffffffe30),
                                  in_stack_fffffffffffffe2c);
        }
        else {
          local_50 = (char *)(ulong)(pSVar6->p).ptr32;
        }
        *local_50 = '\n';
        (pSVar6->p).ptr32 = (int)local_50 + 1;
        lex_newline((LexState *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        if (in_RSI == (LexState *)0x0) {
          (in_RDI->sb).p.ptr32 = (in_RDI->sb).b.ptr32;
        }
      }
      if (iVar7 == 0x5d) break;
      LVar1 = in_RDI->c;
      pSVar6 = &in_RDI->sb;
      if ((in_RDI->sb).e.ptr32 == (pSVar6->p).ptr32) {
        local_38 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30
                                                ),in_stack_fffffffffffffe2c);
      }
      else {
        local_38 = (char *)(ulong)(pSVar6->p).ptr32;
      }
      *local_38 = (char)LVar1;
      (pSVar6->p).ptr32 = (int)local_38 + 1;
      if (in_RDI->p < in_RDI->pe) {
        pbVar2 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar2 + 1);
        in_stack_fffffffffffffe30 = (uint)*pbVar2;
      }
      else {
        in_stack_fffffffffffffe30 = lex_more((LexState *)CONCAT44(uVar4,iVar7));
      }
      in_RDI->c = in_stack_fffffffffffffe30;
    }
    iVar3 = lex_skipeq(in_stack_fffffffffffffe40);
  } while (iVar3 != in_EDX);
  LVar1 = in_RDI->c;
  pSVar6 = &in_RDI->sb;
  if ((in_RDI->sb).e.ptr32 == (pSVar6->p).ptr32) {
    local_20 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe2c);
  }
  else {
    local_20 = (char *)(ulong)(pSVar6->p).ptr32;
  }
  *local_20 = (char)LVar1;
  (pSVar6->p).ptr32 = (int)local_20 + 1;
  if (in_RDI->p < in_RDI->pe) {
    pbVar2 = (byte *)in_RDI->p;
    in_RDI->p = (char *)(pbVar2 + 1);
    uVar4 = (uint)*pbVar2;
  }
  else {
    uVar4 = lex_more((LexState *)CONCAT44(uVar4,iVar7));
  }
  in_RDI->c = uVar4;
  if (in_RSI != (LexState *)0x0) {
    pGVar5 = lj_parse_keepstr(in_RSI,(char *)CONCAT44(in_EDX,in_stack_fffffffffffffe48),
                              (size_t)in_stack_fffffffffffffe40);
    *(int *)&in_RSI->fs = (int)pGVar5;
    *(undefined4 *)((long)&in_RSI->fs + 4) = 0xfffffffb;
  }
  return;
}

Assistant:

static void lex_longstring(LexState *ls, TValue *tv, int sep)
{
  lex_savenext(ls);  /* Skip second '['. */
  if (lex_iseol(ls))  /* Skip initial newline. */
    lex_newline(ls);
  for (;;) {
    switch (ls->c) {
    case LEX_EOF:
      lj_lex_error(ls, TK_eof, tv ? LJ_ERR_XLSTR : LJ_ERR_XLCOM);
      break;
    case ']':
      if (lex_skipeq(ls) == sep) {
	lex_savenext(ls);  /* Skip second ']'. */
	goto endloop;
      }
      break;
    case '\n':
    case '\r':
      lex_save(ls, '\n');
      lex_newline(ls);
      if (!tv) lj_buf_reset(&ls->sb);  /* Don't waste space for comments. */
      break;
    default:
      lex_savenext(ls);
      break;
    }
  } endloop:
  if (tv) {
    GCstr *str = lj_parse_keepstr(ls, sbufB(&ls->sb) + (2 + (MSize)sep),
				      sbuflen(&ls->sb) - 2*(2 + (MSize)sep));
    setstrV(ls->L, tv, str);
  }
}